

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O3

vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_> * __thiscall
ChebTools::ChebyshevExpansion::subdivide
          (vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
           *__return_storage_ptr__,ChebyshevExpansion *this,size_t Nintervals,size_t Norder)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  ulong uVar5;
  double dVar6;
  long lVar7;
  void *pvVar8;
  undefined8 *puVar9;
  ulong uVar10;
  char *__function;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double *pdVar16;
  double dVar17;
  VectorXd xpts_n11;
  VectorXd xrealworld;
  void *local_158;
  ulong local_150;
  void *local_148;
  undefined8 uStack_140;
  ulong local_130;
  long local_128;
  size_t local_120;
  ChebyshevExpansion local_118;
  double local_d8;
  double dStack_d0;
  ChebyshevExpansion local_c8;
  double local_88;
  undefined1 local_80;
  double local_78;
  undefined8 local_68;
  double local_58;
  double *local_48;
  
  if (Nintervals == 1) {
    std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>::
    vector(__return_storage_ptr__,1,this,(allocator_type *)&local_c8);
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dVar6 = (double)(Norder + 1);
    if ((long)dVar6 < 0) {
      __function = 
      "Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::linspaced_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
      ;
LAB_001088d6:
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CwiseNullaryOp.h"
                    ,0x4a,__function);
    }
    auVar13._8_4_ = (int)(Norder >> 0x20);
    auVar13._0_8_ = Norder;
    auVar13._12_4_ = 0x45300000;
    dVar17 = this->m_xmax;
    local_c8.m_nodal_value_cache.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
    m_storage.m_data =
         (double *)
         ((auVar13._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)Norder) - 4503599627370496.0));
    local_88 = 0.0;
    if (Norder != 0) {
      local_88 = (double)local_c8.m_nodal_value_cache.
                         super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data / (double)(long)Norder;
    }
    dVar4 = this->m_xmin;
    local_c8.m_nodal_value_cache.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
    m_storage.m_rows = Norder + (Norder == 0);
    local_c8.m_recurrence_buffer.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    m_storage.m_rows = 0;
    local_80 = 0;
    local_68 = 0x400921fb54442d18;
    local_120 = Norder;
    local_c8.m_xmax = dVar6;
    local_78 = dVar6;
    local_58 = dVar6;
    local_48 = local_c8.m_nodal_value_cache.
               super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cos_op<double>,Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_158,
               (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_cos_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::linspaced_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
                *)&local_c8);
    local_128 = Nintervals - 1;
    auVar12._8_4_ = (int)((ulong)local_128 >> 0x20);
    auVar12._0_8_ = local_128;
    auVar12._12_4_ = 0x45300000;
    dVar6 = (dVar17 - dVar4) /
            ((auVar12._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)local_128) - 4503599627370496.0));
    local_130 = 0x1fffffffffffffff;
    lVar7 = 0;
    do {
      uVar5 = local_150;
      lVar1 = lVar7 + 1;
      if ((long)local_150 < 0) {
        __function = 
        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Array<double, -1, 1>]"
        ;
        goto LAB_001088d6;
      }
      auVar14._8_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar14._0_8_ = lVar7;
      auVar14._12_4_ = 0x45300000;
      dStack_d0 = auVar14._8_8_ - 1.9342813113834067e+25;
      local_d8 = (dStack_d0 + ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) *
                 dVar6 + this->m_xmin;
      auVar15._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar15._0_8_ = lVar1;
      auVar15._12_4_ = 0x45300000;
      local_118.m_nodal_value_cache.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_rows = (Index)(auVar15._8_8_ - 1.9342813113834067e+25);
      local_118.m_nodal_value_cache.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_data =
           (double *)
           (((double)local_118.m_nodal_value_cache.
                     super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            + ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * dVar6 + this->m_xmin
           );
      local_148 = (void *)0x0;
      uStack_140 = 0;
      if (local_150 == 0) {
        uVar10 = 0;
        pdVar16 = (double *)
                  ((double)local_118.m_nodal_value_cache.
                           super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
                           m_data - local_d8);
        dVar17 = (double)local_118.m_nodal_value_cache.
                         super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data + local_d8;
      }
      else {
        if (local_130 < local_150) {
LAB_00108893:
          puVar9 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar9 = operator_new;
          __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        local_118.m_xmin =
             (double)local_118.m_nodal_value_cache.
                     super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
             + local_d8;
        local_118.m_xmax =
             (double)local_118.m_nodal_value_cache.
                     super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        local_118.m_recurrence_buffer.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
        .m_storage.m_data =
             (double *)
             ((double)local_118.m_nodal_value_cache.
                      super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
             - local_d8);
        local_118.m_recurrence_buffer.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
        .m_storage.m_rows =
             local_118.m_nodal_value_cache.
             super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        pvVar8 = malloc(local_150 * 8);
        if (uVar5 != 1 && ((ulong)pvVar8 & 0xf) != 0) {
          __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/util/Memory.h"
                        ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
        }
        if (pvVar8 == (void *)0x0) goto LAB_00108893;
        uVar10 = uVar5 & 0x1ffffffffffffffe;
        pdVar16 = local_118.m_recurrence_buffer.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        dVar17 = local_118.m_xmin;
        local_148 = pvVar8;
        if (uVar5 != 1) {
          uVar11 = 0;
          do {
            pdVar2 = (double *)((long)local_158 + uVar11 * 8);
            dVar4 = pdVar2[1];
            pdVar3 = (double *)((long)pvVar8 + uVar11 * 8);
            *pdVar3 = (*pdVar2 * (double)local_118.m_recurrence_buffer.
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                         .m_storage.m_data + local_118.m_xmin) * 0.5;
            pdVar3[1] = (dVar4 * (double)local_118.m_recurrence_buffer.
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                         .m_storage.m_data + local_118.m_xmin) * 0.5;
            uVar11 = uVar11 + 2;
          } while (uVar11 < uVar10);
        }
      }
      pvVar8 = local_148;
      if ((long)uVar10 < (long)uVar5) {
        do {
          *(double *)((long)local_148 + uVar10 * 8) =
               (*(double *)((long)local_158 + uVar10 * 8) * (double)pdVar16 + dVar17) * 0.5;
          uVar10 = uVar10 + 1;
        } while (uVar5 != uVar10);
      }
      y(&local_118,&this->m_c);
      factoryf(&local_c8,local_120,&local_118.m_c,local_d8,
               (double)local_118.m_nodal_value_cache.
                       super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data);
      std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>::
      emplace_back<ChebTools::ChebyshevExpansion>(__return_storage_ptr__,&local_c8);
      free(local_c8.m_nodal_value_cache.
           super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      free(local_c8.m_recurrence_buffer.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      free(local_c8.m_c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data);
      free(local_118.m_c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data);
      free(pvVar8);
      lVar7 = lVar1;
    } while (lVar1 != local_128);
    free(local_158);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ChebyshevExpansion> ChebyshevExpansion::subdivide(std::size_t Nintervals, const std::size_t Norder) const {

        if (Nintervals == 1) {
            return std::vector<ChebyshevExpansion>(1, *this);
        }

        std::vector<ChebyshevExpansion> segments;
        double deltax = (m_xmax - m_xmin) / (Nintervals - 1);

        // Vector of values in the range [-1,1] as roots of a high-order Chebyshev
        double NN = static_cast<double>(Norder);
        Eigen::VectorXd xpts_n11 = (Eigen::VectorXd::LinSpaced(Norder + 1, 0, NN)*EIGEN_PI/NN).array().cos();

        for (std::size_t i = 0; i < Nintervals - 1; ++i) {
            double xmin = m_xmin + i*deltax, xmax = m_xmin + (i + 1)*deltax;
            Eigen::VectorXd xrealworld = ((xmax - xmin)*xpts_n11.array() + (xmax + xmin)) / 2.0;
            segments.push_back(factoryf(Norder, y(xrealworld), xmin, xmax));
        }
        return segments;
    }